

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

path * __thiscall filesystem::path::make_absolute(path *__return_storage_ptr__,path *this)

{
  char *pcVar1;
  runtime_error *this_00;
  int *piVar2;
  char temp [4096];
  allocator<char> local_1069;
  string local_1068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1048;
  char local_1028 [4104];
  
  str_abi_cxx11_(&local_1068,this,native_path);
  pcVar1 = realpath(local_1068._M_dataplus._M_p,local_1028);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1068._M_dataplus._M_p != &local_1068.field_2) {
    operator_delete(local_1068._M_dataplus._M_p,local_1068.field_2._M_allocated_capacity + 1);
  }
  if (pcVar1 != (char *)0x0) {
    path(__return_storage_ptr__,local_1028);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar2 = __errno_location();
  pcVar1 = strerror(*piVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1048,pcVar1,&local_1069);
  std::operator+(&local_1068,"Internal error in realpath(): ",&local_1048);
  std::runtime_error::runtime_error(this_00,(string *)&local_1068);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

path make_absolute() const {
#if !defined(_WIN32)
        char temp[PATH_MAX];
        if (realpath(str().c_str(), temp) == NULL)
            throw std::runtime_error("Internal error in realpath(): " + std::string(strerror(errno)));
        return path(temp);
#else
        std::wstring value = wstr(), out(MAX_PATH_WINDOWS, '\0');
        DWORD length = GetFullPathNameW(value.c_str(), MAX_PATH_WINDOWS, &out[0], NULL);
        if (length == 0)
            throw std::runtime_error("Internal error in realpath(): " + std::to_string(GetLastError()));
        return path(out.substr(0, length));
#endif
    }